

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void temp_sync(TCGContext_conflict9 *s,TCGTemp *ts,TCGRegSet allocated_regs,TCGRegSet preferred_regs
              ,int free_or_dead)

{
  _Bool _Var1;
  int free_or_dead_local;
  TCGRegSet preferred_regs_local;
  TCGRegSet allocated_regs_local;
  TCGTemp *ts_local;
  TCGContext_conflict9 *s_local;
  
  if ((*(ulong *)ts >> 0x20 & 1) != 0) {
    return;
  }
  if ((*(ulong *)ts >> 0x23 & 1) != 0) goto LAB_012dbb60;
  if ((*(ulong *)ts >> 0x24 & 1) == 0) {
    temp_allocate_frame(s,ts);
  }
  switch(ts->field_0x1) {
  case 0:
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
            ,0xb91);
    abort();
  case 1:
switchD_012dba43_caseD_1:
    tcg_out_st(s,(TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x18) & 0xff,
               (TCGReg)*(undefined8 *)ts & 0xff,(TCGReg)*(undefined8 *)ts->mem_base & 0xff,
               ts->mem_offset);
    break;
  case 2:
    break;
  case 3:
    if ((free_or_dead == 0) ||
       (_Var1 = tcg_out_sti(s,(TCGType_conflict)((ulong)*(undefined8 *)ts >> 0x18) & 0xff,ts->val,
                            (TCGReg)*(undefined8 *)ts->mem_base & 0xff,ts->mem_offset), !_Var1)) {
      temp_load(s,ts,s->tcg_target_available_regs[(uint)((ulong)*(undefined8 *)ts >> 0x18) & 0xff],
                allocated_regs,preferred_regs);
      goto switchD_012dba43_caseD_1;
    }
  }
  *(ulong *)ts = *(ulong *)ts & 0xfffffff7ffffffff | 0x800000000;
LAB_012dbb60:
  if (free_or_dead != 0) {
    temp_free_or_dead(s,ts,free_or_dead);
  }
  return;
}

Assistant:

static void temp_sync(TCGContext *s, TCGTemp *ts, TCGRegSet allocated_regs,
                      TCGRegSet preferred_regs, int free_or_dead)
{
    if (ts->fixed_reg) {
        return;
    }
    if (!ts->mem_coherent) {
        if (!ts->mem_allocated) {
            temp_allocate_frame(s, ts);
        }
        switch (ts->val_type) {
        case TEMP_VAL_CONST:
            /* If we're going to free the temp immediately, then we won't
               require it later in a register, so attempt to store the
               constant to memory directly.  */
            if (free_or_dead
                && tcg_out_sti(s, ts->type, ts->val,
                               ts->mem_base->reg, ts->mem_offset)) {
                break;
            }
            temp_load(s, ts, s->tcg_target_available_regs[ts->type],
                      allocated_regs, preferred_regs);
            /* fallthrough */

        case TEMP_VAL_REG:
            tcg_out_st(s, ts->type, ts->reg,
                       ts->mem_base->reg, ts->mem_offset);
            break;

        case TEMP_VAL_MEM:
            break;

        case TEMP_VAL_DEAD:
        default:
            tcg_abort();
        }
        ts->mem_coherent = 1;
    }
    if (free_or_dead) {
        temp_free_or_dead(s, ts, free_or_dead);
    }
}